

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list.hpp
# Opt level: O2

void __thiscall
pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list
          (intrusive_list<(anonymous_namespace)::value> *this)

{
  check(this);
  std::unique_ptr<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  ::~unique_ptr(&this->tail_);
  std::unique_ptr<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  ::~unique_ptr(&this->head_);
  return;
}

Assistant:

~intrusive_list () noexcept { this->check (); }